

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

void __thiscall
spv::Builder::makeSwitch
          (Builder *this,Id selector,uint control,int numSegments,Vector<int> *caseValues,
          Vector<int> *valueIndexToSegment,int defaultSegment,Vector<Block_*> *segmentBlocks)

{
  Function *parent;
  pointer piVar1;
  Block *pBVar2;
  tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_> this_00;
  pointer ppBVar3;
  Id IVar4;
  int i;
  long lVar5;
  int iVar6;
  bool bVar7;
  Block *mergeBlock;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_40;
  uint local_38;
  Id local_34;
  
  parent = this->buildPoint->parent;
  iVar6 = 0;
  local_38 = control;
  local_34 = selector;
  if (0 < numSegments) {
    iVar6 = numSegments;
  }
  while( true ) {
    bVar7 = iVar6 == 0;
    iVar6 = iVar6 + -1;
    if (bVar7) break;
    pBVar2 = (Block *)dxil_spv::allocate_in_thread(0x78);
    IVar4 = this->uniqueId + 1;
    this->uniqueId = IVar4;
    Block::Block(pBVar2,IVar4,parent);
    mergeBlock = pBVar2;
    std::vector<spv::Block*,dxil_spv::ThreadLocalAllocator<spv::Block*>>::emplace_back<spv::Block*>
              ((vector<spv::Block*,dxil_spv::ThreadLocalAllocator<spv::Block*>> *)segmentBlocks,
               &mergeBlock);
  }
  pBVar2 = (Block *)dxil_spv::allocate_in_thread(0x78);
  IVar4 = this->uniqueId + 1;
  this->uniqueId = IVar4;
  Block::Block(pBVar2,IVar4,parent);
  mergeBlock = pBVar2;
  createSelectionMerge(this,pBVar2,local_38);
  this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
       dxil_spv::allocate_in_thread(0x38);
  *(undefined ***)
   this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
   super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = &PTR__Instruction_001e31e0;
  *(undefined8 *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8) = 0;
  *(Op *)((long)this_00.
                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x10) = OpSwitch;
  (((Vector<Id> *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18))->
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) = (pointer)0x0;
  *(pointer *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28) = (pointer)0x0;
  *(Block **)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30) = (Block *)0x0;
  Instruction::addIdOperand
            ((Instruction *)
             this_00.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,local_34);
  ppBVar3 = (segmentBlocks->
            super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>)._M_impl
            .super__Vector_impl_data._M_start + (uint)defaultSegment;
  if (defaultSegment < 0) {
    ppBVar3 = &mergeBlock;
  }
  pBVar2 = *ppBVar3;
  Instruction::addIdOperand
            ((Instruction *)
             this_00.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,
             *(Id *)((long)(((pBVar2->instructions).
                             super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                           super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                           ._M_t + 8));
  Block::addPredecessor(pBVar2,this->buildPoint);
  for (lVar5 = 0;
      piVar1 = (caseValues->super__Vector_base<int,_dxil_spv::ThreadLocalAllocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
      lVar5 < (int)((ulong)((long)(caseValues->
                                  super__Vector_base<int,_dxil_spv::ThreadLocalAllocator<int>_>).
                                  _M_impl.super__Vector_impl_data._M_finish - (long)piVar1) >> 2);
      lVar5 = lVar5 + 1) {
    Instruction::addImmediateOperand
              ((Instruction *)
               this_00.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,piVar1[lVar5]);
    Instruction::addIdOperand
              ((Instruction *)
               this_00.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,
               *(Id *)(**(long **)&((segmentBlocks->
                                    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start
                                    [(valueIndexToSegment->
                                     super__Vector_base<int,_dxil_spv::ThreadLocalAllocator<int>_>).
                                     _M_impl.super__Vector_impl_data._M_start[lVar5]]->instructions)
                                   .
                                   super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                                   ._M_impl.super__Vector_impl_data + 8));
    Block::addPredecessor
              ((segmentBlocks->
               super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>).
               _M_impl.super__Vector_impl_data._M_start
               [(valueIndexToSegment->super__Vector_base<int,_dxil_spv::ThreadLocalAllocator<int>_>)
                ._M_impl.super__Vector_impl_data._M_start[lVar5]],this->buildPoint);
  }
  local_40._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
       (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
       (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
       this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
       super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
  Block::addInstruction
            (this->buildPoint,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_40);
  if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
      local_40._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
    (**(code **)(*(long *)local_40._M_t.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))();
  }
  local_40._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
       (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
       (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)0x0;
  std::deque<spv::Block_*,_std::allocator<spv::Block_*>_>::push_back
            (&(this->switchMerges).c,&mergeBlock);
  return;
}

Assistant:

void Builder::makeSwitch(Id selector, unsigned int control, int numSegments, const dxil_spv::Vector<int>& caseValues,
                         const dxil_spv::Vector<int>& valueIndexToSegment, int defaultSegment,
                         dxil_spv::Vector<Block*>& segmentBlocks)
{
    Function& function = buildPoint->getParent();

    // make all the blocks
    for (int s = 0; s < numSegments; ++s)
        segmentBlocks.push_back(new Block(getUniqueId(), function));

    Block* mergeBlock = new Block(getUniqueId(), function);

    // make and insert the switch's selection-merge instruction
    createSelectionMerge(mergeBlock, control);

    // make the switch instruction
    Instruction* switchInst = new Instruction(NoResult, NoType, OpSwitch);
    switchInst->addIdOperand(selector);
    auto defaultOrMerge = (defaultSegment >= 0) ? segmentBlocks[defaultSegment] : mergeBlock;
    switchInst->addIdOperand(defaultOrMerge->getId());
    defaultOrMerge->addPredecessor(buildPoint);
    for (int i = 0; i < (int)caseValues.size(); ++i) {
        switchInst->addImmediateOperand(caseValues[i]);
        switchInst->addIdOperand(segmentBlocks[valueIndexToSegment[i]]->getId());
        segmentBlocks[valueIndexToSegment[i]]->addPredecessor(buildPoint);
    }
    buildPoint->addInstruction(std::unique_ptr<Instruction>(switchInst));

    // push the merge block
    switchMerges.push(mergeBlock);
}